

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

double mxx::allreduce<double,std::plus<double>>(undefined8 x,MPI_Op param_2)

{
  MPI_Datatype poVar1;
  MPI_Op poVar2;
  MPI_Comm poVar3;
  double local_70;
  double result;
  undefined1 local_60 [8];
  custom_op<double,_true> op;
  comm *comm_local;
  double *x_local;
  
  op.m_op = param_2;
  custom_op<double,true>::custom_op<std::plus<double>>();
  poVar1 = custom_op<double,_true>::get_type((custom_op<double,_true> *)local_60);
  poVar2 = custom_op<double,_true>::get_op((custom_op<double,_true> *)local_60);
  poVar3 = comm::operator_cast_to_ompi_communicator_t_((comm *)op.m_op);
  MPI_Allreduce(x,&local_70,1,poVar1,poVar2,poVar3);
  custom_op<double,_true>::~custom_op((custom_op<double,_true> *)local_60);
  return local_70;
}

Assistant:

inline T allreduce(const T& x, Func func, const mxx::comm& comm = mxx::comm()) {
    // get custom op (and type for custom op)
    mxx::custom_op<T> op(std::forward<Func>(func));
    // perform reduction
    T result;
    MPI_Allreduce(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    return result;
}